

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

int __thiscall
CTcTokenizer::expand_macro
          (CTcTokenizer *this,CTcMacroRsc *rsc,CTcTokString *expbuf,CTcTokString *srcbuf,
          utf8_ptr *src,size_t macro_srcbuf_ofs,CTcHashEntryPp *entry,int read_more,
          int allow_defined,int *expanded)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char flagbuf [9];
  size_t arglen [128];
  size_t argofs [128];
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  *expanded = 0;
  lVar5 = (long)src->p_ - (long)srcbuf->buf_;
  (*expbuf->_vptr_CTcTokString[9])(expbuf);
  if ((entry->field_0x44 & 1) == 0) goto LAB_002576cd;
  iVar2 = parse_macro_actuals(this,srcbuf,src,entry,argofs,arglen,read_more,(int *)flagbuf);
  if (iVar2 == 0) {
    if (flagbuf._0_4_ == 0) {
      (*expbuf->_vptr_CTcTokString[8])
                (expbuf,srcbuf->buf_ + macro_srcbuf_ofs,lVar5 - macro_srcbuf_ofs);
      src->p_ = srcbuf->buf_ + lVar5;
      iVar2 = 0;
      goto LAB_002576ac;
    }
    bVar1 = true;
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
LAB_002576ac:
    bVar1 = false;
  }
  if (!bVar1) {
    return iVar2;
  }
LAB_002576cd:
  if (entry->argc_ == 0) {
    iVar2 = (*(entry->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[3])(entry);
    pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*(entry->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[4])(entry);
    sVar4 = CONCAT44(extraout_var_00,iVar2);
  }
  else {
    iVar2 = substitute_macro_actuals
                      (this,rsc,&rsc->macro_exp_,entry,srcbuf,argofs,arglen,allow_defined);
    if (iVar2 != 0) {
      return 1;
    }
    pcVar3 = (rsc->macro_exp_).buf_;
    sVar4 = (rsc->macro_exp_).buf_len_;
  }
  (*expbuf->_vptr_CTcTokString[8])(expbuf,pcVar3,sVar4);
  flagbuf._1_3_ = SUB83(entry,0);
  flagbuf[0] = '\x03';
  flagbuf._4_5_ = (undefined5)((ulong)entry >> 0x18);
  (*expbuf->_vptr_CTcTokString[4])(expbuf,flagbuf,9);
  *expanded = 1;
  return 0;
}

Assistant:

int CTcTokenizer::expand_macro(CTcMacroRsc *rsc, CTcTokString *expbuf,
                               const CTcTokString *srcbuf, utf8_ptr *src,
                               size_t macro_srcbuf_ofs,
                               CTcHashEntryPp *entry, int read_more,
                               int allow_defined, int *expanded)
{
    CTcTokString *subexp;
    size_t argofs[TOK_MAX_MACRO_ARGS];
    size_t arglen[TOK_MAX_MACRO_ARGS];
    size_t startofs;
    const char *start;
    const char *end;
    int err;
    char flagbuf[1 + sizeof(entry)];

    /* presume we won't do any expansion */
    *expanded = FALSE;

    /* get our resources */
    subexp = &rsc->macro_exp_;

    /* remember our parsing starting offset */
    startofs = src->getptr() - srcbuf->get_text();

    /* clear the expansion output buffer */
    expbuf->clear_text();

    /* if the macro has arguments, scan the actuals */
    if (entry->has_args())
    {
        int found_actuals;

        /* read the macro arguments */
        if (parse_macro_actuals(srcbuf, src, entry, argofs, arglen,
                                read_more, &found_actuals))
        {
            err = 1;
            goto done;
        }

        /* 
         *   If we found no actuals, then this wasn't really an invocation
         *   of the macro after all - a function-like macro invoked with
         *   no arguments is simply not replaced.  Store the original text
         *   in the output buffer and return success.  
         */
        if (!found_actuals)
        {
            /* copy the original text */
            expbuf->copy(srcbuf->get_text() + macro_srcbuf_ofs,
                         startofs - macro_srcbuf_ofs);

            /* 
             *   restore the source read pointer to where it was when we
             *   started 
             */
            src->set((char *)srcbuf->get_text() + startofs);

            /* return success */
            err = 0;
            goto done;
        }
    }

    /* 
     *   if there are arguments, replace the macro and substitute actuals
     *   for the formals; otherwise, just copy the replacement text
     *   directly 
     */
    if (entry->get_argc() != 0)
    {
        /* substitute the actuals */
        if (substitute_macro_actuals(rsc, subexp, entry, srcbuf,
                                     argofs, arglen, allow_defined))
        {
            err = 1;
            goto done;
        }

        /* set up to parse from the expansion buffer */
        start = subexp->get_text();
        end = start + subexp->get_text_len();
    }
    else
    {
        /* 
         *   use our local source buffer that simply references the
         *   original expansion text, rather than making a copy of the
         *   expansion text 
         */
        start = entry->get_expansion();
        end = start + entry->get_expan_len();
    }

    /* copy the expansion into the output buffer */
    expbuf->copy(start, end - start);

    /*
     *   After the end of the expansion sequence, insert the
     *   fully-expanded flag plus a pointer to the symbol table entry that
     *   we just expanded.  This will allow us to detect during the
     *   re-scan of the expansion text that this symbol has already been
     *   expanded, in which case we must suppress further expansion of the
     *   symbol.  This allows us to follow the ANSI C rules for recursive
     *   macro usage.  
     */
    flagbuf[0] = TOK_MACRO_EXP_END;
    memcpy(&flagbuf[1], &entry, sizeof(entry));
    expbuf->append(flagbuf, sizeof(flagbuf));

    /* indicate that we expanded the macro */
    *expanded = TRUE;

    /* success */
    err = 0;

done:
    /* return the result */
    return err;
}